

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::EndDeadLifetimes(LinearScan *this,Instr *instr,bool isLoopBackEdge)

{
  NodeBase **this_00;
  RealCount *pRVar1;
  RegNum RVar2;
  uint uVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  code *pcVar6;
  SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *buffer_00;
  bool bVar7;
  BOOLEAN BVar8;
  uint32 uVar9;
  undefined4 *puVar10;
  Type *ppLVar11;
  StackSlot *pSVar12;
  Type pSVar13;
  ulong uVar14;
  Type pLVar15;
  ulong uVar16;
  undefined1 local_70 [8];
  EditingIterator iter;
  EditingIterator stackPackIter;
  
  bVar7 = SkipNumberedInstr(this,instr);
  if (!bVar7) {
    local_70 = (undefined1  [8])this->activeLiveranges;
    iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    iter.super_EditingIterator.super_Iterator.list =
         (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_70;
    bVar7 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_70);
    if (bVar7) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        ppLVar11 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)local_70);
        uVar3 = (*ppLVar11)->end;
        uVar9 = IR::Instr::GetNumber(instr);
        if (uVar9 < uVar3) break;
        if ((!isLoopBackEdge) ||
           (BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                               ((*ppLVar11)->sym->super_Sym).m_id), BVar8 == '\0')) {
          SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar11)->defList);
          SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar11)->useList);
          RVar2 = (*ppLVar11)->reg;
          uVar16 = (ulong)RVar2;
          BVUnitT<unsigned_long>::AssertRange((uint)RVar2);
          uVar14 = -2L << (RVar2 & (RegXMM15|RegXMM14)) |
                   0xfffffffffffffffeU >> 0x40 - (RVar2 & (RegXMM15|RegXMM14));
          (this->activeRegs).word = (this->activeRegs).word & uVar14;
          this->regContent[uVar16] = (Lifetime *)0x0;
          BVUnitT<unsigned_long>::AssertRange((uint)RVar2);
          (this->secondChanceRegs).word = (this->secondChanceRegs).word & uVar14;
          if (uVar16 - 1 < 0x10) {
            this->intRegUsedCount = this->intRegUsedCount - 1;
          }
          else {
            if (0xf < uVar16 - 0x11) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0x958,"(RegTypes[reg] == TyFloat64)","RegTypes[reg] == TyFloat64")
              ;
              if (!bVar7) goto LAB_0057e1dc;
              *puVar10 = 0;
            }
            this->floatRegUsedCount = this->floatRegUsedCount - 1;
          }
          buffer_00 = iter.super_EditingIterator.super_Iterator.list;
          pAVar4 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
                    ((long)local_70 + 0x10);
          SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
          UnlinkCurrentNode((EditingIterator *)local_70);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    (pAVar4,buffer_00,0x10);
        }
        bVar7 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                          ((EditingIterator *)local_70);
      } while (bVar7);
    }
    buffer = this->stackPackInUseLiveRanges;
    iter.super_EditingIterator.last = (NodeBase *)buffer;
    bVar7 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)&iter.super_EditingIterator.last);
    if (bVar7) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      this_00 = &iter.super_EditingIterator.last;
      do {
        ppLVar11 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)this_00);
        uVar3 = (*ppLVar11)->end;
        uVar9 = IR::Instr::GetNumber(instr);
        if (uVar9 < uVar3) {
          return;
        }
        if ((!isLoopBackEdge) ||
           (BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                               ((*ppLVar11)->sym->super_Sym).m_id), BVar8 == '\0')) {
          SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar11)->defList);
          SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar11)->useList);
          pLVar15 = *ppLVar11;
          if ((pLVar15->field_0x9d & 0x10) == 0) {
            pSVar12 = pLVar15->spillStackSlot;
            if (pSVar12 == (StackSlot *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0x971,"(deadStackPack->spillStackSlot)",
                                 "deadStackPack->spillStackSlot");
              if (!bVar7) {
LAB_0057e1dc:
                pcVar6 = (code *)invalidInstructionException();
                (*pcVar6)();
              }
              *puVar10 = 0;
              pLVar15 = *ppLVar11;
              pSVar12 = pLVar15->spillStackSlot;
            }
            pSVar12->lastUse = pLVar15->end;
            pSVar5 = this->stackSlotsFreeList;
            pSVar13 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar5->allocator,0x364470);
            pSVar13[1].next = (Type)pLVar15->spillStackSlot;
            pSVar13->next =
                 (pSVar5->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
            (pSVar5->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar13;
            pRVar1 = &(pSVar5->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).
                      super_RealCount;
            pRVar1->count = pRVar1->count + 1;
          }
          pAVar4 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                   iter.super_EditingIterator.last[2].next;
          SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
          UnlinkCurrentNode((EditingIterator *)this_00);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    (pAVar4,buffer,0x10);
        }
        bVar7 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                          ((EditingIterator *)this_00);
      } while (bVar7);
    }
  }
  return;
}

Assistant:

void
LinearScan::EndDeadLifetimes(IR::Instr *instr, bool isLoopBackEdge)
{
    if (this->SkipNumberedInstr(instr))
    {
        return;
    }

    // Retire all active lifetime ending at this instruction
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, deadLifetime, this->activeLiveranges, iter)
    {
        if (deadLifetime->end > instr->GetNumber())
        {
            break;
        }

        if (isLoopBackEdge && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(deadLifetime->sym->m_id))
        {
            continue;
        }
        deadLifetime->defList.Clear();
        deadLifetime->useList.Clear();

        RegNum reg = deadLifetime->reg;
        this->activeRegs.Clear(reg);
        this->regContent[reg] = nullptr;
        this->secondChanceRegs.Clear(reg);
        if (RegTypes[reg] == TyMachReg)
        {
            this->intRegUsedCount--;
        }
        else
        {
            Assert(RegTypes[reg] == TyFloat64);
            this->floatRegUsedCount--;
        }
        iter.RemoveCurrent();

    } NEXT_SLIST_ENTRY_EDITING;

    // Look for spilled lifetimes which end here such that we can make their stack slot
    // available for stack-packing.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, deadStackPack, this->stackPackInUseLiveRanges, stackPackIter)
    {
        if (deadStackPack->end > instr->GetNumber())
        {
            break;
        }

        if (isLoopBackEdge && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(deadStackPack->sym->m_id))
        {
            continue;
        }
        deadStackPack->defList.Clear();
        deadStackPack->useList.Clear();

        if (!deadStackPack->cantStackPack)
        {
            Assert(deadStackPack->spillStackSlot);
            deadStackPack->spillStackSlot->lastUse = deadStackPack->end;
            this->stackSlotsFreeList->Push(deadStackPack->spillStackSlot);
        }
        stackPackIter.RemoveCurrent();
    } NEXT_SLIST_ENTRY_EDITING;

}